

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O0

region * __thiscall toml::detail::repeat_exact::scan(repeat_exact *this,location *loc)

{
  bool bVar1;
  scanner_storage *in_RSI;
  region *in_RDI;
  region reg;
  size_t i;
  location first;
  region *this_00;
  location *in_stack_ffffffffffffff28;
  location *in_stack_ffffffffffffff30;
  location *in_stack_ffffffffffffff38;
  region *in_stack_ffffffffffffff40;
  scanner_base *local_68;
  
  this_00 = in_RDI;
  location::location(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  for (local_68 = (scanner_base *)0x0;
      local_68 <
      in_RSI[1].scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      local_68 = (scanner_base *)((long)&local_68->_vptr_scanner_base + 1)) {
    scanner_storage::scan(in_RSI,(location *)this_00);
    bVar1 = region::is_ok((region *)0x1fc7e7);
    if (!bVar1) {
      location::operator=((location *)this_00,(location *)in_RDI);
      region::region(in_stack_ffffffffffffff40);
    }
    region::~region(this_00);
    if (!bVar1) goto LAB_001fc89e;
  }
  region::region(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
LAB_001fc89e:
  location::~location((location *)this_00);
  return this_00;
}

Assistant:

TOML11_INLINE region repeat_exact::scan(location& loc) const
{
    const auto first = loc;
    for(std::size_t i=0; i<length_; ++i)
    {
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            loc = first;
            return region{};
        }
    }
    return region(first, loc);
}